

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllOnes(IEEEFloat *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Significand *pSVar5;
  
  uVar1 = this->semantics->precision;
  if (uVar1 - 0x40 < 0xffffff80) {
    pSVar5 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar5 = &this->significand;
  }
  uVar3 = (uVar1 + 0x40 >> 6) - 1;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      if (pSVar5[uVar4].part != 0xffffffffffffffff) {
        return false;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  iVar2 = (uVar1 + 0x40 & 0xffffffc0) - uVar1;
  if (iVar2 + 1U < 0x41) {
    return (-1L << (~(byte)iVar2 & 0x3f) | pSVar5[uVar3].part) == 0xffffffffffffffff;
  }
  __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"fill than integerPartWidth\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x314,"bool llvm::detail::IEEEFloat::isSignificandAllOnes() const");
}

Assistant:

bool IEEEFloat::isSignificandAllOnes() const {
  // Test if the significand excluding the integral bit is all ones. This allows
  // us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();
  for (unsigned i = 0; i < PartCount - 1; i++)
    if (~Parts[i])
      return false;

  // Set the unused high bits to all ones when we compare.
  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "fill than integerPartWidth");
  const integerPart HighBitFill =
    ~integerPart(0) << (integerPartWidth - NumHighBits);
  if (~(Parts[PartCount - 1] | HighBitFill))
    return false;

  return true;
}